

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O2

void __thiscall
icu_63::ChineseCalendar::computeChineseFields
          (ChineseCalendar *this,int32_t days,int32_t gyear,int32_t gmonth,UBool setAllFields)

{
  _func_int *p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  bool bVar9;
  uint uVar10;
  int32_t yearOfCycle;
  
  iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x32])(this,(ulong)(uint)gyear);
  p_Var1 = (this->super_Calendar).super_UObject._vptr_UObject[0x32];
  if (days < iVar2) {
    iVar3 = (*p_Var1)(this,(ulong)(gyear - 1));
    iVar7 = iVar2;
  }
  else {
    iVar7 = (*p_Var1)(this,(ulong)(gyear + 1));
    iVar3 = iVar2;
  }
  uVar4 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])((double)(iVar3 + 1),this,1);
  uVar10 = 0;
  uVar5 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])((double)(iVar7 + 1),this,0);
  iVar2 = days + 1;
  uVar6 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])((double)iVar2,this,0);
  iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x34])
                    (this,(ulong)uVar4,(ulong)uVar5);
  (this->super_Calendar).field_0x262 = iVar3 == 0xc;
  iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x34])
                    (this,(ulong)uVar4,(ulong)uVar6);
  if ((this->super_Calendar).field_0x262 == '\0') {
    iVar7 = iVar3 + 0xc;
    if (0 < iVar3) {
      iVar7 = iVar3;
    }
  }
  else {
    iVar7 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x37])
                      (this,(ulong)uVar4,(ulong)uVar6);
    iVar3 = iVar3 + -1 + (uint)((char)iVar7 == '\0');
    iVar7 = iVar3 + 0xc;
    if (0 < iVar3) {
      iVar7 = iVar3;
    }
    if ((this->super_Calendar).field_0x262 != '\0') {
      iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x36])(this,(ulong)uVar6);
      if ((char)iVar3 != '\0') {
        uVar5 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                          ((double)(int)(uVar6 - 0x19),this,0);
        iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x37])
                          (this,(ulong)uVar4,(ulong)uVar5);
        uVar10 = (uint)((char)iVar3 == '\0');
      }
    }
  }
  (this->super_Calendar).fFields[2] = iVar7 + -1;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[0x16] = uVar10;
  (this->super_Calendar).fStamp[0x16] = 1;
  (this->super_Calendar).fIsSet[0x16] = '\x01';
  if (setAllFields != '\0') {
    bVar9 = 5 < gmonth || iVar7 < 0xb;
    (this->super_Calendar).fFields[0x13] =
         ((uint)bVar9 + gyear) - *(int *)&(this->super_Calendar).field_0x264;
    (this->super_Calendar).fStamp[0x13] = 1;
    (this->super_Calendar).fIsSet[0x13] = '\x01';
    iVar8 = ClockMath::floorDivide((double)(int)((uint)bVar9 + gyear + 0xa4b),0x3c,&yearOfCycle);
    (this->super_Calendar).fFields[0] = iVar8 + 1;
    (this->super_Calendar).fStamp[0] = 1;
    (this->super_Calendar).fIsSet[0] = '\x01';
    (this->super_Calendar).fFields[1] = yearOfCycle + 1;
    (this->super_Calendar).fStamp[1] = 1;
    (this->super_Calendar).fIsSet[1] = '\x01';
    (this->super_Calendar).fFields[5] = iVar2 - uVar6;
    (this->super_Calendar).fStamp[5] = 1;
    (this->super_Calendar).fIsSet[5] = '\x01';
    iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x39])(this,(ulong)(uint)gyear);
    if (days < iVar3) {
      iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x39])(this,(ulong)(gyear - 1));
    }
    (this->super_Calendar).fFields[6] = iVar2 - iVar3;
    (this->super_Calendar).fStamp[6] = 1;
    (this->super_Calendar).fIsSet[6] = '\x01';
  }
  return;
}

Assistant:

void ChineseCalendar::computeChineseFields(int32_t days, int32_t gyear, int32_t gmonth,
                                  UBool setAllFields) {

    // Find the winter solstices before and after the target date.
    // These define the boundaries of this Chinese year, specifically,
    // the position of month 11, which always contains the solstice.
    // We want solsticeBefore <= date < solsticeAfter.
    int32_t solsticeBefore;
    int32_t solsticeAfter = winterSolstice(gyear);
    if (days < solsticeAfter) {
        solsticeBefore = winterSolstice(gyear - 1);
    } else {
        solsticeBefore = solsticeAfter;
        solsticeAfter = winterSolstice(gyear + 1);
    }

    // Find the start of the month after month 11.  This will be either
    // the prior month 12 or leap month 11 (very rare).  Also find the
    // start of the following month 11.
    int32_t firstMoon = newMoonNear(solsticeBefore + 1, TRUE);
    int32_t lastMoon = newMoonNear(solsticeAfter + 1, FALSE);
    int32_t thisMoon = newMoonNear(days + 1, FALSE); // Start of this month
    // Note: isLeapYear is a member variable
    isLeapYear = synodicMonthsBetween(firstMoon, lastMoon) == 12;

    int32_t month = synodicMonthsBetween(firstMoon, thisMoon);
    if (isLeapYear && isLeapMonthBetween(firstMoon, thisMoon)) {
        month--;
    }
    if (month < 1) {
        month += 12;
    }

    UBool isLeapMonth = isLeapYear &&
        hasNoMajorSolarTerm(thisMoon) &&
        !isLeapMonthBetween(firstMoon, newMoonNear(thisMoon - SYNODIC_GAP, FALSE));

    internalSet(UCAL_MONTH, month-1); // Convert from 1-based to 0-based
    internalSet(UCAL_IS_LEAP_MONTH, isLeapMonth?1:0);

    if (setAllFields) {

        // Extended year and cycle year is based on the epoch year
        
        int32_t extended_year = gyear - fEpochYear;
        int cycle_year = gyear - CHINESE_EPOCH_YEAR;
        if (month < 11 ||
            gmonth >= UCAL_JULY) {
            extended_year++;
            cycle_year++;
        }
        int32_t dayOfMonth = days - thisMoon + 1;

        internalSet(UCAL_EXTENDED_YEAR, extended_year);

        // 0->0,60  1->1,1  60->1,60  61->2,1  etc.
        int32_t yearOfCycle;
        int32_t cycle = ClockMath::floorDivide(cycle_year - 1, 60, yearOfCycle);
        internalSet(UCAL_ERA, cycle + 1);
        internalSet(UCAL_YEAR, yearOfCycle + 1);

        internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);

        // Days will be before the first new year we compute if this
        // date is in month 11, leap 11, 12.  There is never a leap 12.
        // New year computations are cached so this should be cheap in
        // the long run.
        int32_t theNewYear = newYear(gyear);
        if (days < theNewYear) {
            theNewYear = newYear(gyear-1);
        }
        internalSet(UCAL_DAY_OF_YEAR, days - theNewYear + 1);
    }
}